

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlEncOutputChunk(xmlCharEncodingHandler *handler,uchar *out,int *outlen,uchar *in,int *inlen)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  uchar *puStack_40;
  uchar *puStack_38;
  size_t sStack_30;
  size_t sStack_28;
  
  if (handler->output != (xmlCharEncodingOutputFunc)0x0) {
    uVar1 = (*handler->output)(out,outlen,in,inlen);
    return uVar1 & (int)uVar1 >> 0x1f;
  }
  if (handler->iconv_out == (iconv_t)0x0) {
    *outlen = 0;
    *inlen = 0;
    return -4;
  }
  if ((((outlen == (int *)0x0) || (in == (uchar *)0x0)) || (out == (uchar *)0x0)) ||
     (inlen == (int *)0x0)) {
    iVar2 = -1;
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
  }
  else {
    sStack_28 = (size_t)*inlen;
    sStack_30 = (size_t)*outlen;
    puStack_40 = out;
    puStack_38 = in;
    sVar3 = iconv(handler->iconv_out,(char **)&puStack_38,&sStack_28,(char **)&puStack_40,&sStack_30
                 );
    *inlen = *inlen - (int)sStack_28;
    *outlen = *outlen - (int)sStack_30;
    if ((sStack_28 != 0) || (iVar2 = 0, (int)sVar3 == -1)) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (iVar2 == 0x54) {
        iVar2 = -2;
      }
      else if ((iVar2 == 0x16) || (iVar2 != 7)) {
        iVar2 = -3;
      }
      else {
        iVar2 = -1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlEncOutputChunk(xmlCharEncodingHandler *handler, unsigned char *out,
                  int *outlen, const unsigned char *in, int *inlen) {
    int ret;

    if (handler->output != NULL) {
        ret = handler->output(out, outlen, in, inlen);
        if (ret > 0)
           ret = 0;
    }
#ifdef LIBXML_ICONV_ENABLED
    else if (handler->iconv_out != NULL) {
        ret = xmlIconvWrapper(handler->iconv_out, out, outlen, in, inlen);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    else if (handler->uconv_out != NULL) {
        ret = xmlUconvWrapper(handler->uconv_out, 0, out, outlen, in, inlen,
                              1);
    }
#endif /* LIBXML_ICU_ENABLED */
    else {
        *outlen = 0;
        *inlen = 0;
        ret = -4;
    }

    return(ret);
}